

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

u_char * ngx_strlcasestrn(u_char *s1,u_char *last,u_char *s2,size_t n)

{
  byte bVar1;
  ngx_int_t nVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  
  bVar1 = *s2;
  bVar4 = bVar1 | 0x20;
  if (0x19 < (byte)(bVar1 + 0xbf)) {
    bVar4 = bVar1;
  }
  do {
    pbVar5 = s1;
    if (last + -n <= pbVar5) {
      return (u_char *)0x0;
    }
    s1 = pbVar5 + 1;
    bVar1 = *pbVar5;
    bVar3 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar3 = bVar1;
    }
  } while ((bVar3 != bVar4) || (nVar2 = ngx_strncasecmp(s1,s2 + 1,n), nVar2 != 0));
  return pbVar5;
}

Assistant:

u_char *
ngx_strlcasestrn(u_char *s1, u_char *last, u_char *s2, size_t n)
{
    ngx_uint_t  c1, c2;

    c2 = (ngx_uint_t) *s2++;
    c2 = (c2 >= 'A' && c2 <= 'Z') ? (c2 | 0x20) : c2;
    last -= n;

    do {
        do {
            if (s1 >= last) {
                return NULL;
            }

            c1 = (ngx_uint_t) *s1++;

            c1 = (c1 >= 'A' && c1 <= 'Z') ? (c1 | 0x20) : c1;

        } while (c1 != c2);

    } while (ngx_strncasecmp(s1, s2, n) != 0);

    return --s1;
}